

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerators::SetupAutoUicTarget
          (cmQtAutoGenerators *this,cmTarget *target,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configUicOptions)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  mapped_type *this_01;
  string *path;
  char *pcVar3;
  cmTarget *pcVar4;
  pointer config;
  pointer ppcVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  allocator local_1b2;
  allocator local_1b1;
  string opts;
  string uiFileFiles;
  string _uic_opts;
  string targetName;
  string local_128;
  string uiFileOptions;
  string local_e8;
  char *local_c8;
  cmMakefile *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipVec;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> uiFilesWithOptions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipped;
  
  pcVar1 = target->Makefile;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &skipped._M_t._M_impl.super__Rb_tree_header._M_header;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  skipVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  skipVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  skipVec.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmSystemTools::ExpandListArgument(&this->SkipUic,&skipVec,false);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&skipped,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )skipVec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )skipVec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&_uic_opts,"_skip_uic",(allocator *)&uiFileFiles);
  cmOutputConverter::EscapeForCMake(&local_e8,&this->SkipUic);
  cmMakefile::AddDefinition(pcVar1,&_uic_opts,local_e8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&_uic_opts);
  cmMakefile::GetQtUiFilesWithOptions(&uiFilesWithOptions,pcVar1);
  std::__cxx11::string::string((string *)&_uic_opts,"_target_qt_version",(allocator *)&local_e8);
  local_c8 = cmMakefile::GetDefinition(pcVar1,&_uic_opts);
  std::__cxx11::string::~string((string *)&_uic_opts);
  _uic_opts._M_dataplus._M_p = (pointer)&_uic_opts.field_2;
  _uic_opts._M_string_length = 0;
  _uic_opts.field_2._M_local_buf[0] = '\0';
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_e8,pcVar1,&configs,true);
  GetUicOpts(target,&local_e8,&_uic_opts);
  if (_uic_opts._M_string_length != 0) {
    cmOutputConverter::EscapeForCMake(&uiFileFiles,&_uic_opts);
    std::__cxx11::string::operator=((string *)&_uic_opts,(string *)&uiFileFiles);
    std::__cxx11::string::~string((string *)&uiFileFiles);
    std::__cxx11::string::string
              ((string *)&uiFileFiles,"_uic_target_options",(allocator *)&uiFileOptions);
    cmMakefile::AddDefinition(pcVar1,&uiFileFiles,_uic_opts._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&uiFileFiles);
  }
  local_c0 = pcVar1;
  for (config = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uiFileFiles._M_dataplus._M_p = (pointer)&uiFileFiles.field_2,
      config != configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
    uiFileFiles._M_string_length = 0;
    uiFileFiles.field_2._M_local_buf[0] = '\0';
    GetUicOpts(target,config,&uiFileFiles);
    bVar2 = std::operator!=(&uiFileFiles,&_uic_opts);
    if (bVar2) {
      cmOutputConverter::EscapeForCMake(&uiFileOptions,&uiFileFiles);
      this_01 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](configUicOptions,config);
      std::__cxx11::string::operator=((string *)this_01,(string *)&uiFileOptions);
      std::__cxx11::string::~string((string *)&uiFileOptions);
      if (_uic_opts._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&_uic_opts);
      }
    }
    std::__cxx11::string::~string((string *)&uiFileFiles);
  }
  uiFileFiles._M_string_length = 0;
  uiFileFiles.field_2._M_local_buf[0] = '\0';
  uiFileOptions._M_dataplus._M_p = (pointer)&uiFileOptions.field_2;
  uiFileOptions._M_string_length = 0;
  uiFileOptions.field_2._M_local_buf[0] = '\0';
  for (ppcVar5 = uiFilesWithOptions.
                 super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar5 !=
      uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
      .super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    this_00 = *ppcVar5;
    path = cmSourceFile::GetFullPath(this_00,(string *)0x0);
    cmsys::SystemTools::GetRealPath(&targetName,path,(string *)0x0);
    pVar6 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&skipped,&targetName);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::__cxx11::string::append((char *)&uiFileFiles);
      std::__cxx11::string::append((string *)&uiFileFiles);
      std::__cxx11::string::append((char *)&uiFileOptions);
      std::__cxx11::string::string((string *)&local_128,"AUTOUIC_OPTIONS",&local_1b1);
      pcVar3 = cmSourceFile::GetProperty(this_00,&local_128);
      std::__cxx11::string::string((string *)&opts,pcVar3,&local_1b2);
      std::__cxx11::string::~string((string *)&local_128);
      cmsys::SystemTools::ReplaceString(&opts,";","@list_sep@");
      std::__cxx11::string::append((string *)&uiFileOptions);
      std::__cxx11::string::~string((string *)&opts);
    }
    std::__cxx11::string::~string((string *)&targetName);
  }
  std::__cxx11::string::string
            ((string *)&targetName,"_qt_uic_options_files",(allocator *)&local_128);
  cmOutputConverter::EscapeForCMake(&opts,&uiFileFiles);
  pcVar1 = local_c0;
  cmMakefile::AddDefinition(local_c0,&targetName,opts._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::string
            ((string *)&targetName,"_qt_uic_options_options",(allocator *)&local_128);
  cmOutputConverter::EscapeForCMake(&opts,&uiFileOptions);
  cmMakefile::AddDefinition(pcVar1,&targetName,opts._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&opts);
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::string((string *)&targetName,(string *)&target->Name);
  if (*local_c8 == '4') {
    if (local_c8[1] != '\0') goto LAB_0034b945;
    std::__cxx11::string::string((string *)&opts,"Qt4::uic",(allocator *)&local_128);
    pcVar4 = cmMakefile::FindTargetToUse(pcVar1,&opts,false);
    std::__cxx11::string::~string((string *)&opts);
    if (pcVar4 == (cmTarget *)0x0) {
      cmSystemTools::Error
                ("Qt4::uic target not found ",targetName._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      goto LAB_0034b95a;
    }
    std::__cxx11::string::string((string *)&opts,"_qt_uic_executable",&local_1b1);
    std::__cxx11::string::string((string *)&local_128,"",&local_1b2);
    pcVar3 = cmTarget::GetLocation(pcVar4,&local_128);
    cmMakefile::AddDefinition(pcVar1,&opts,pcVar3);
  }
  else {
    if ((*local_c8 != '5') || (local_c8[1] != '\0')) {
LAB_0034b945:
      cmSystemTools::Error
                ("The CMAKE_AUTOUIC feature supports only Qt 4 and Qt 5 ",
                 targetName._M_dataplus._M_p,(char *)0x0,(char *)0x0);
      goto LAB_0034b95a;
    }
    std::__cxx11::string::string((string *)&opts,"Qt5::uic",(allocator *)&local_128);
    pcVar4 = cmMakefile::FindTargetToUse(pcVar1,&opts,false);
    std::__cxx11::string::~string((string *)&opts);
    if (pcVar4 == (cmTarget *)0x0) goto LAB_0034b95a;
    std::__cxx11::string::string((string *)&opts,"_qt_uic_executable",&local_1b1);
    std::__cxx11::string::string((string *)&local_128,"",&local_1b2);
    pcVar3 = cmTarget::GetLocation(pcVar4,&local_128);
    cmMakefile::AddDefinition(pcVar1,&opts,pcVar3);
  }
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&opts);
LAB_0034b95a:
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::~string((string *)&uiFileOptions);
  std::__cxx11::string::~string((string *)&uiFileFiles);
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::__cxx11::string::~string((string *)&_uic_opts);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&skipVec);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&skipped._M_t);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoUicTarget(cmTarget const* target,
                          std::map<std::string, std::string> &configUicOptions)
{
  cmMakefile *makefile = target->GetMakefile();

  std::set<std::string> skipped;
  std::vector<std::string> skipVec;
  cmSystemTools::ExpandListArgument(this->SkipUic, skipVec);
  skipped.insert(skipVec.begin(), skipVec.end());

  makefile->AddDefinition("_skip_uic",
          cmOutputConverter::EscapeForCMake(this->SkipUic).c_str());

  std::vector<cmSourceFile*> uiFilesWithOptions
                                        = makefile->GetQtUiFilesWithOptions();

  const char *qtVersion = makefile->GetDefinition("_target_qt_version");

  std::string _uic_opts;
  std::vector<std::string> configs;
  const std::string& config = makefile->GetConfigurations(configs);
  GetUicOpts(target, config, _uic_opts);

  if (!_uic_opts.empty())
    {
    _uic_opts = cmOutputConverter::EscapeForCMake(_uic_opts);
    makefile->AddDefinition("_uic_target_options", _uic_opts.c_str());
    }
  for (std::vector<std::string>::const_iterator li = configs.begin();
       li != configs.end(); ++li)
    {
    std::string config_uic_opts;
    GetUicOpts(target, *li, config_uic_opts);
    if (config_uic_opts != _uic_opts)
      {
      configUicOptions[*li] =
                    cmOutputConverter::EscapeForCMake(config_uic_opts);
      if(_uic_opts.empty())
        {
        _uic_opts = config_uic_opts;
        }
      }
    }

  std::string uiFileFiles;
  std::string uiFileOptions;
  const char* sep = "";

  for(std::vector<cmSourceFile*>::const_iterator fileIt =
      uiFilesWithOptions.begin();
      fileIt != uiFilesWithOptions.end();
      ++fileIt)
    {
    cmSourceFile* sf = *fileIt;
    std::string absFile = cmsys::SystemTools::GetRealPath(
                                                    sf->GetFullPath());

    if (!skipped.insert(absFile).second)
      {
      continue;
      }
    uiFileFiles += sep;
    uiFileFiles += absFile;
    uiFileOptions += sep;
    std::string opts = sf->GetProperty("AUTOUIC_OPTIONS");
    cmSystemTools::ReplaceString(opts, ";", "@list_sep@");
    uiFileOptions += opts;
    sep = ";";
    }

  makefile->AddDefinition("_qt_uic_options_files",
              cmOutputConverter::EscapeForCMake(uiFileFiles).c_str());
  makefile->AddDefinition("_qt_uic_options_options",
            cmOutputConverter::EscapeForCMake(uiFileOptions).c_str());

  std::string targetName = target->GetName();
  if (strcmp(qtVersion, "5") == 0)
    {
    cmTarget *qt5Uic = makefile->FindTargetToUse("Qt5::uic");
    if (!qt5Uic)
      {
      // Project does not use Qt5Widgets, but has AUTOUIC ON anyway
      }
    else
      {
      makefile->AddDefinition("_qt_uic_executable", qt5Uic->GetLocation(""));
      }
    }
  else if (strcmp(qtVersion, "4") == 0)
    {
    cmTarget *qt4Uic = makefile->FindTargetToUse("Qt4::uic");
    if (!qt4Uic)
      {
      cmSystemTools::Error("Qt4::uic target not found ",
                          targetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_uic_executable", qt4Uic->GetLocation(""));
    }
  else
    {
    cmSystemTools::Error("The CMAKE_AUTOUIC feature supports only Qt 4 and "
                        "Qt 5 ", targetName.c_str());
    }
}